

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

void __thiscall
Gudhi::ripser::
Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>>
::
add_coboundary<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t>>>
          (Persistent_cohomology<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>>
           *this,Compressed_sparse_matrix *reduction_matrix,
          vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
          *columns_to_reduce,size_t index_column_to_add,coefficient_t factor,dimension_t dim,
          Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>_>
          *working_reduction_column,
          Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>_>,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>_>
          *working_coboundary)

{
  ulong *puVar1;
  pointer pdVar2;
  pointer puVar3;
  unsigned_long uVar4;
  pointer pdVar5;
  ulong uVar6;
  unsigned_long uVar7;
  long lVar8;
  diameter_entry_t simplex;
  diameter_entry_t simplex_00;
  entry_plain_t aeStack_40 [2];
  
  pdVar2 = (columns_to_reduce->
           super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_simplex_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
  simplex.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
  ._4_4_ = 0;
  simplex.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
  .first = pdVar2[index_column_to_add].diameter;
  simplex.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
  .second.index = pdVar2[index_column_to_add].index;
  add_simplex_coboundary<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t>>>
            (this,simplex,dim,working_reduction_column,working_coboundary);
  puVar3 = (reduction_matrix->bounds).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index_column_to_add == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = puVar3[index_column_to_add - 1];
  }
  uVar4 = puVar3[index_column_to_add];
  if (uVar7 != uVar4) {
    pdVar5 = (reduction_matrix->entries).
             super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::diameter_entry_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = uVar7 << 4;
    do {
      puVar1 = (ulong *)((long)&(pdVar5->
                                super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
                                ).first + lVar8);
      uVar6 = *puVar1;
      aeStack_40[0].index = puVar1[1];
      Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
      ::set_coefficient(aeStack_40,factor % *(uint *)(this + 0x60));
      simplex_00.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
      .second.index = aeStack_40[0].index;
      simplex_00.
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
      ._0_8_ = uVar6 & 0xffffffff;
      add_simplex_coboundary<Gudhi::ripser::Heap<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t>>,Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>::diameter_entry_t>>>
                (this,simplex_00,dim,working_reduction_column,working_coboundary);
      lVar8 = lVar8 + 0x10;
    } while (uVar4 << 4 != lVar8);
  }
  return;
}

Assistant:

void add_coboundary(Compressed_sparse_matrix& reduction_matrix,
        const std::vector<diameter_simplex_t>& columns_to_reduce,
        const size_t index_column_to_add, const coefficient_t factor,
        const dimension_t dim, Column& working_reduction_column,
        Column& working_coboundary) {
      diameter_entry_t column_to_add = filt.make_diameter_entry(columns_to_reduce[index_column_to_add], factor);
      add_simplex_coboundary(column_to_add, dim, working_reduction_column, working_coboundary);

      for (diameter_entry_t simplex : reduction_matrix.subrange(index_column_to_add)) {
        filt.set_coefficient(simplex, filt.get_coefficient(simplex) * factor % modulus);
        add_simplex_coboundary(simplex, dim, working_reduction_column, working_coboundary);
      }
    }